

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_widget_is_hovered(nk_context *ctx)

{
  int iVar1;
  bool local_2d;
  undefined1 local_2c [8];
  nk_rect bounds;
  int ret;
  nk_context *ctx_local;
  
  unique0x1000010f = ctx;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x48a3,"int nk_widget_is_hovered(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if ((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) {
      ctx_local._4_4_ = 0;
    }
    else {
      nk_layout_peek((nk_rect *)local_2c,ctx);
      bounds.w = (float)(uint)(stack0xffffffffffffffe8->active == stack0xffffffffffffffe8->current);
      local_2d = false;
      if (bounds.w != 0.0) {
        iVar1 = nk_input_is_mouse_hovering_rect(&stack0xffffffffffffffe8->input,_local_2c);
        local_2d = iVar1 != 0;
      }
      ctx_local._4_4_ = (uint)local_2d;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x48a4,"int nk_widget_is_hovered(struct nk_context *)");
}

Assistant:

NK_API int
nk_widget_is_hovered(struct nk_context *ctx)
{
    int ret;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    ret = (ctx->active == ctx->current);
    ret = ret && nk_input_is_mouse_hovering_rect(&ctx->input, bounds);
    return ret;
}